

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_102615::DiskInterfaceTest::SetUp(DiskInterfaceTest *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Ninja-DiskInterfaceTest","");
  ScopedTempDir::CreateAndEnter(&this->temp_dir_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void SetUp() {
    // These tests do real disk accesses, so create a temp dir.
    temp_dir_.CreateAndEnter("Ninja-DiskInterfaceTest");
  }